

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void __thiscall Executor::visit(Executor *this,FunctionResultCallNode *node)

{
  ExpressionNode *pEVar1;
  unique_ptr<Value,_std::default_delete<Value>_> *in_RSI;
  undefined8 in_RDI;
  Node *unaff_retaddr;
  string *in_stack_00000008;
  TypeName *in_stack_00000010;
  Value *in_stack_00000018;
  Executor *in_stack_00000020;
  Value *in_stack_000004f8;
  string *in_stack_00000500;
  CallNode *in_stack_00000508;
  Executor *in_stack_00000510;
  unique_ptr<Value,_std::default_delete<Value>_> *in_stack_ffffffffffffff60;
  allocator<char> local_71;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_39;
  string local_38 [36];
  undefined4 local_14;
  unique_ptr<Value,_std::default_delete<Value>_> *local_10;
  
  local_10 = in_RSI;
  pEVar1 = FunctionResultCallNode::getCall((FunctionResultCallNode *)0x15b951);
  (*(pEVar1->super_Node)._vptr_Node[2])(pEVar1,in_RDI);
  std::unique_ptr<Value,_std::default_delete<Value>_>::operator*(in_stack_ffffffffffffff60);
  local_14 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  assertValueType(in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                  unaff_retaddr);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::unique_ptr<Value,_std::default_delete<Value>_>::operator*(local_10);
  callValue(in_stack_00000510,in_stack_00000508,in_stack_00000500,in_stack_000004f8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::allocator<char>::~allocator(&local_71);
  return;
}

Assistant:

void Executor::visit(const FunctionResultCallNode& node)
{
  node.getCall().accept(*this);
  assertValueType(*value_, TypeName::Function, "function call", node);

  callValue(node, "result", *value_);
}